

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

void __thiscall inja::Bytecode::Bytecode(Bytecode *this,Op op,string_view str,uint flags)

{
  const_pointer local_28;
  size_type local_20;
  
  local_20 = str.size_;
  local_28 = str.data_;
  this->op = op;
  *(uint *)&this->field_0x4 = flags << 0x1e;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&this->value,(nullptr_t)0x0);
  nonstd::sv_lite::basic_string_view::operator_cast_to_string
            (&this->str,(basic_string_view *)&local_28);
  return;
}

Assistant:

explicit Bytecode(Op op, nonstd::string_view str, unsigned int flags) : op(op), args(0), flags(flags), str(str) {}